

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<float>::TPZVec(TPZVec<float> *this,TPZVec<float> *rval)

{
  ulong uVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  uVar1 = rval->fNElements;
  this->fNElements = uVar1;
  lVar2 = rval->fNAlloc;
  if (lVar2 == 0) {
    pfVar4 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    this->fStore = pfVar4;
    if (0 < (long)uVar1) {
      pfVar3 = rval->fStore;
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar3[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar2;
    rval->fStore = (float *)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}